

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec2 __thiscall djb::microfacet::s2_to_u2(microfacet *this,vec3 *wo,vec3 *wi,void *user_args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  args *paVar6;
  float_t fVar7;
  vec2 vVar8;
  args args;
  vec3 local_70;
  args local_64;
  
  fVar7 = wi->z;
  if (fVar7 < 0.0) {
    __assert_fail("wi.z >= 0 && \"invalid incident direction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x5cf,
                  "virtual vec2 djb::microfacet::s2_to_u2(const vec3 &, const vec3 &, const void *) const"
                 );
  }
  if (user_args == (void *)0x0) {
    local_70 = (vec3)(ZEXT412(0x3f800000) << 0x40);
    microfacet::args::normalmap(&local_64,&local_70,1.0,1.0,0.0);
    fVar7 = wi->z;
  }
  else {
    paVar6 = &local_64;
    for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
      (paVar6->mtra).r[0].x = *user_args;
      user_args = (float_t *)((long)user_args + 4);
      paVar6 = (args *)&(paVar6->mtra).r[0].y;
    }
  }
  uVar1 = wi->x;
  uVar3 = wi->y;
  uVar2 = wo->x;
  uVar4 = wo->y;
  local_70.y = (float)uVar4 + (float)uVar3;
  local_70.x = (float)uVar2 + (float)uVar1;
  local_70.z = fVar7 + wo->z;
  local_70 = normalize(&local_70);
  vVar8 = h2_to_u2(this,&local_70,wi,&local_64);
  return vVar8;
}

Assistant:

vec2
microfacet::s2_to_u2(
	const vec3 &wo, const vec3 &wi, const void *user_args
) const {
	DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_u2(s2_to_h2(wo, wi), wi, args);
}